

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcmEvents.c
# Opt level: O3

XcmeContext_s * XcmeContext_New(void)

{
  XcmeContext_s *pXVar1;
  
  pXVar1 = (XcmeContext_s *)calloc(0x90,1);
  if (pXVar1 != (XcmeContext_s *)0x0) {
    pXVar1->type = 1000;
    pXVar1->screen = -1;
  }
  return pXVar1;
}

Assistant:

XcmeContext_s * XcmeContext_New      ( )
{
  XcmeContext_s * c = (XcmeContext_s*) calloc( sizeof(XcmeContext_s), 1 );
  if(!c)
    return c;

  c->type = 1000;
  c->display = 0;
  c->display_is_owned = 0;
  c->screen = -1;
  c->root = 0;
  c->nWindows = 0;
  c->Windows = 0;
  c->w = 0;
  c->old_pid = 0;
  /*c->aProfile, c->aOutputs, c->aCM, c->aRegion, c->aDesktop;, c->aAdvanced*/

  return c;
}